

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall FIX::FieldBase::encodeTo(FieldBase *this,string *result)

{
  size_type sVar1;
  char *buf;
  int iVar2;
  size_t len;
  
  iVar2 = number_of_symbols_in(this->m_tag);
  len = (size_t)iVar2;
  sVar1 = (this->m_string)._M_string_length;
  std::__cxx11::string::resize((ulong)result);
  buf = (result->_M_dataplus)._M_p;
  integer_to_string(buf,len,this->m_tag);
  buf[len] = '=';
  memcpy(buf + len + 1,(this->m_string)._M_dataplus._M_p,(this->m_string)._M_string_length);
  buf[sVar1 + len + 1] = '\x01';
  return;
}

Assistant:

void encodeTo( std::string& result ) const
  {
    size_t tagLength = FIX::number_of_symbols_in( m_tag );
    size_t totalLength = tagLength + m_string.length() + 2;

    result.resize( totalLength );

    char * buf = (char*)result.c_str();
    FIX::integer_to_string( buf, tagLength, m_tag );

    buf[tagLength] = '=';
    memcpy( buf + tagLength + 1, m_string.data(), m_string.length() );
    buf[totalLength - 1] = '\001';
  }